

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O0

void __thiscall
jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<wchar_t>>::
swap_l_r<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<wchar_t>>::uint64_storage,jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<wchar_t>>::byte_string_storage>
          (void *param_1,byte_string_storage *param_2)

{
  byte_string_storage *pbVar1;
  uint64_storage *this;
  byte_string_storage temp;
  basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<wchar_t>_> *in_stack_ffffffffffffffc0;
  byte_string_storage local_28;
  byte_string_storage *local_18;
  void *local_10;
  
  local_18 = param_2;
  local_10 = param_1;
  pbVar1 = cast<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<wchar_t>>::byte_string_storage>
                     (in_stack_ffffffffffffffc0);
  basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<wchar_t>_>::byte_string_storage::
  byte_string_storage(&local_28,pbVar1);
  pbVar1 = local_18;
  this = cast<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<wchar_t>>::uint64_storage>
                   (in_stack_ffffffffffffffc0);
  construct<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<wchar_t>>::uint64_storage,jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<wchar_t>>::uint64_storage&>
            ((basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<wchar_t>_> *)this,
             (uint64_storage *)pbVar1);
  construct<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<wchar_t>>::byte_string_storage,jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<wchar_t>>::byte_string_storage&>
            ((basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<wchar_t>_> *)this,pbVar1);
  return;
}

Assistant:

void swap_l_r(identity<TypeL>,identity<TypeR>,basic_json& other) noexcept
        {
            TypeR temp{other.cast<TypeR>()};
            other.construct<TypeL>(cast<TypeL>());
            construct<TypeR>(temp);
        }